

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O2

void __thiscall
tcu::x11::glx::GlxRenderContext::GlxRenderContext
          (GlxRenderContext *this,GlxContextFactory *factory,RenderConfig *config)

{
  GlxVisual *this_00;
  Functions *this_01;
  Display *pDVar1;
  GlxRenderContext *pGVar2;
  int iVar3;
  uint uVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int numSamples;
  GLXContext p_Var10;
  GlxDrawable *this_02;
  NotSupportedError *this_03;
  long lVar11;
  pointer_____offset_0x10___ *ppuVar12;
  int i;
  long lVar13;
  Rank local_b0;
  long local_a0;
  int local_94;
  int local_90;
  deUint32 local_8c;
  UniquePtr<tcu::x11::glx::GlxDrawable,_de::DefaultDeleter<tcu::x11::glx::GlxDrawable>_> *local_88;
  GlxRenderContext *local_80;
  ulong local_78;
  GlxDisplay *local_70;
  deUint32 local_68;
  int numElems;
  GLXFBConfig local_60;
  GlxFunctionLoader loader;
  int local_50;
  int iStack_4c;
  
  (this->super_RenderContext)._vptr_RenderContext = (_func_int **)&PTR__GlxRenderContext_003d5170;
  local_70 = &this->m_glxDisplay;
  GlxDisplay::GlxDisplay(local_70,factory->m_eventState,(char *)0x0);
  pDVar1 = (this->m_glxDisplay).super_XlibDisplay.m_display;
  numElems = 0;
  local_a0 = glXGetFBConfigs(pDVar1,*(undefined4 *)(pDVar1 + 0xe0));
  if (local_a0 == 0) {
    this_03 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    TestError::TestError
              ((TestError *)this_03,"Couldn\'t query framebuffer configurations",
               "fbConfigs != DE_NULL",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
               ,0x252);
    ppuVar12 = &TestError::typeinfo;
  }
  else {
    this_00 = &this->m_glxVisual;
    local_60 = (GLXFBConfig)0x0;
    local_78 = 0;
    local_80 = this;
    for (lVar13 = 0; lVar13 < numElems; lVar13 = lVar13 + 1) {
      GlxVisual::GlxVisual((GlxVisual *)&loader,local_70,*(GLXFBConfig *)(local_a0 + lVar13 * 8));
      if (config->id == -1) {
        for (lVar11 = 0; lVar11 != 0x80; lVar11 = lVar11 + 0x10) {
          iVar3 = *(int *)((long)&(config->type).super_ApiType.m_bits +
                          *(long *)(&DAT_003223a8 + lVar11));
          if (iVar3 != -1) {
            iVar7 = GlxVisual::getAttrib((GlxVisual *)&loader,*(int *)((long)&s_attribs + lVar11));
            if (iVar3 != iVar7) goto LAB_001d7482;
          }
        }
        uVar4 = 0;
        if ((ulong)config->surfaceType < 4) {
          uVar4 = *(uint *)(&DAT_00322a7c + (ulong)config->surfaceType * 4);
        }
        uVar8 = GlxVisual::getAttrib((GlxVisual *)&loader,0x8010);
        if (((uVar8 & uVar4) != 0) &&
           ((config->surfaceType != SURFACETYPE_WINDOW || (CONCAT44(iStack_4c,local_50) != 0))))
        goto LAB_001d71e9;
      }
      else {
        iVar3 = GlxVisual::getAttrib((GlxVisual *)&loader,0x8013);
        if (iVar3 == config->id) {
LAB_001d71e9:
          iVar3 = GlxVisual::getAttrib((GlxVisual *)&loader,5);
          if (iVar3 != 0) {
            uVar4 = GlxVisual::getAttrib((GlxVisual *)&loader,0x8011);
            if ((uVar4 & 1) != 0) {
              local_b0.m_value = 0;
              local_b0.m_bitsLeft = 0x40;
              iVar3 = GlxVisual::getAttrib((GlxVisual *)&loader,0x20);
              local_88 = (UniquePtr<tcu::x11::glx::GlxDrawable,_de::DefaultDeleter<tcu::x11::glx::GlxDrawable>_>
                          *)CONCAT44(local_88._4_4_,iVar3);
              local_68 = GlxVisual::getAttrib((GlxVisual *)&loader,8);
              dVar5 = GlxVisual::getAttrib((GlxVisual *)&loader,9);
              dVar6 = GlxVisual::getAttrib((GlxVisual *)&loader,10);
              local_8c = GlxVisual::getAttrib((GlxVisual *)&loader,0xb);
              local_90 = GlxVisual::getAttrib((GlxVisual *)&loader,0xc);
              local_94 = GlxVisual::getAttrib((GlxVisual *)&loader,0xd);
              if ((int)dVar5 < (int)dVar6) {
                dVar6 = dVar5;
              }
              if ((int)local_68 < (int)dVar6) {
                dVar6 = local_68;
              }
              Rank::add(&local_b0,1,(uint)((int)local_88 != 0x800d));
              iVar3 = GlxVisual::getAttrib((GlxVisual *)&loader,0x23);
              Rank::add(&local_b0,1,(uint)(iVar3 == 0x8000));
              iVar3 = GlxVisual::getAttrib((GlxVisual *)&loader,6);
              Rank::add(&local_b0,1,(uint)(iVar3 == 0));
              iVar3 = GlxVisual::getAttrib((GlxVisual *)&loader,3);
              Rank::add(&local_b0,1,(uint)(iVar3 == 0));
              Rank::add(&local_b0,1,(uint)(0 < (int)local_8c));
              Rank::add(&local_b0,1,(uint)(0 < local_90));
              Rank::add(&local_b0,1,(uint)(0 < local_94));
              Rank::add(&local_b0,1,(uint)((int)local_88 != 0x8001));
              dVar5 = local_8c;
              if ((int)dVar6 < (int)local_8c) {
                dVar5 = dVar6;
              }
              Rank::add(&local_b0,4,dVar5);
              Rank::add(&local_b0,4,dVar6);
              Rank::add(&local_b0,6,local_94 + local_90);
              dVar6 = GlxVisual::getAttrib((GlxVisual *)&loader,0x186a1);
              Rank::sub(&local_b0,5,dVar6);
              uVar4 = GlxVisual::getAttrib((GlxVisual *)&loader,0x22);
              Rank::add(&local_b0,1,(uint)((uVar4 & 0xfffffffe) == 0x8002));
              if (local_78 < local_b0.m_value) {
                local_60 = *(GLXFBConfig *)(local_a0 + lVar13 * 8);
                local_78 = local_b0.m_value;
              }
            }
          }
        }
      }
LAB_001d7482:
    }
    XFree(local_a0);
    pGVar2 = local_80;
    if (local_78 != 0) {
      GlxVisual::GlxVisual(this_00,local_70,local_60);
      (pGVar2->m_type).super_ApiType.m_bits = (config->type).super_ApiType.m_bits;
      p_Var10 = GlxVisual::createContext
                          (this_00,factory,&config->type,config->resetNotificationStrategy);
      pGVar2->m_GLXContext = p_Var10;
      this_02 = createDrawable(this_00,config);
      (pGVar2->m_glxDrawable).
      super_UniqueBase<tcu::x11::glx::GlxDrawable,_de::DefaultDeleter<tcu::x11::glx::GlxDrawable>_>.
      m_data.ptr = this_02;
      local_88 = &pGVar2->m_glxDrawable;
      iVar3 = GlxDrawable::getWidth(this_02);
      local_a0 = CONCAT44(local_a0._4_4_,iVar3);
      iVar3 = GlxDrawable::getHeight
                        ((pGVar2->m_glxDrawable).
                         super_UniqueBase<tcu::x11::glx::GlxDrawable,_de::DefaultDeleter<tcu::x11::glx::GlxDrawable>_>
                         .m_data.ptr);
      iVar7 = GlxVisual::getAttrib(this_00,8);
      iVar9 = GlxVisual::getAttrib(this_00,9);
      GlxVisual::getAttrib(this_00,10);
      GlxVisual::getAttrib(this_00,0xb);
      loader.super_FunctionLoader._vptr_FunctionLoader._4_4_ = iVar9;
      loader.super_FunctionLoader._vptr_FunctionLoader._0_4_ = iVar7;
      iVar7 = GlxVisual::getAttrib(this_00,0xc);
      iVar9 = GlxVisual::getAttrib(this_00,0xd);
      numSamples = GlxVisual::getAttrib(this_00,0x186a1);
      RenderTarget::RenderTarget
                (&local_80->m_renderTarget,(int)local_a0,iVar3,(PixelFormat *)&loader,iVar7,iVar9,
                 numSamples);
      pGVar2 = local_80;
      this_01 = &local_80->m_functions;
      glw::Functions::Functions(this_01);
      loader.super_FunctionLoader._vptr_FunctionLoader = (FunctionLoader)&PTR_get_003d52a8;
      (*(pGVar2->super_RenderContext)._vptr_RenderContext[8])(pGVar2);
      glu::initFunctions(this_01,&loader.super_FunctionLoader,
                         (ApiType)((config->type).super_ApiType.m_bits & 0x3ff));
      return;
    }
    this_03 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    NotSupportedError::NotSupportedError
              (this_03,"Requested GLX configuration not found or unusable",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
               ,0x26d);
    ppuVar12 = &NotSupportedError::typeinfo;
  }
  __cxa_throw(this_03,ppuVar12,Exception::~Exception);
}

Assistant:

GlxRenderContext::GlxRenderContext (const GlxContextFactory&	factory,
									const RenderConfig&			config)
	: m_glxDisplay		(factory.getEventState(), DE_NULL)
	, m_glxVisual		(chooseVisual(m_glxDisplay, config))
	, m_type			(config.type)
	, m_GLXContext		(m_glxVisual.createContext(factory, config.type, config.resetNotificationStrategy))
	, m_glxDrawable		(createDrawable(m_glxVisual, config))
	, m_renderTarget	(m_glxDrawable->getWidth(), m_glxDrawable->getHeight(),
						 PixelFormat(m_glxVisual.getAttrib(GLX_RED_SIZE),
									 m_glxVisual.getAttrib(GLX_GREEN_SIZE),
									 m_glxVisual.getAttrib(GLX_BLUE_SIZE),
									 m_glxVisual.getAttrib(GLX_ALPHA_SIZE)),
						 m_glxVisual.getAttrib(GLX_DEPTH_SIZE),
						 m_glxVisual.getAttrib(GLX_STENCIL_SIZE),
						 m_glxVisual.getAttrib(GLX_SAMPLES))
{
	const GlxFunctionLoader loader;
	makeCurrent();
	glu::initFunctions(&m_functions, &loader, config.type.getAPI());
}